

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImFontGlyphRangesBuilder::BuildRanges
          (ImFontGlyphRangesBuilder *this,ImVector<unsigned_short> *out_ranges)

{
  bool bVar1;
  int n;
  int max_codepoint;
  unsigned_short *in_stack_ffffffffffffffc8;
  uint7 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  undefined4 local_18;
  
  for (local_18 = 0; local_18 < 0x10000; local_18 = local_18 + 1) {
    bVar1 = GetBit((ImFontGlyphRangesBuilder *)
                   CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),
                   (size_t)in_stack_ffffffffffffffc8);
    if (bVar1) {
      ImVector<unsigned_short>::push_back
                ((ImVector<unsigned_short> *)
                 CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),
                 in_stack_ffffffffffffffc8);
      while( true ) {
        in_stack_ffffffffffffffd7 = false;
        if (local_18 < 0xffff) {
          in_stack_ffffffffffffffd7 =
               GetBit((ImFontGlyphRangesBuilder *)(ulong)in_stack_ffffffffffffffd0,
                      (size_t)in_stack_ffffffffffffffc8);
        }
        if ((bool)in_stack_ffffffffffffffd7 == false) break;
        local_18 = local_18 + 1;
      }
      ImVector<unsigned_short>::push_back
                ((ImVector<unsigned_short> *)(ulong)in_stack_ffffffffffffffd0,
                 in_stack_ffffffffffffffc8);
    }
  }
  ImVector<unsigned_short>::push_back
            ((ImVector<unsigned_short> *)
             CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8
            );
  return;
}

Assistant:

void ImFontGlyphRangesBuilder::BuildRanges(ImVector<ImWchar>* out_ranges)
{
    const int max_codepoint = IM_UNICODE_CODEPOINT_MAX;
    for (int n = 0; n <= max_codepoint; n++)
        if (GetBit(n))
        {
            out_ranges->push_back((ImWchar)n);
            while (n < max_codepoint && GetBit(n + 1))
                n++;
            out_ranges->push_back((ImWchar)n);
        }
    out_ranges->push_back(0);
}